

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O0

void __thiscall cmLocalGenerator::AddGeneratorTarget(cmLocalGenerator *this,cmGeneratorTarget *gt)

{
  string *__args;
  cmGeneratorTarget *local_18;
  cmGeneratorTarget *gt_local;
  cmLocalGenerator *this_local;
  
  local_18 = gt;
  gt_local = (cmGeneratorTarget *)this;
  std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::push_back
            (&this->GeneratorTargets,&local_18);
  __args = cmGeneratorTarget::GetName_abi_cxx11_(local_18);
  std::
  unordered_map<std::__cxx11::string,cmGeneratorTarget*,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmGeneratorTarget*>>>
  ::emplace<std::__cxx11::string_const&,cmGeneratorTarget*&>
            ((unordered_map<std::__cxx11::string,cmGeneratorTarget*,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmGeneratorTarget*>>>
              *)&this->GeneratorTargetSearchIndex,__args,&local_18);
  cmGlobalGenerator::IndexGeneratorTarget(this->GlobalGenerator,local_18);
  return;
}

Assistant:

void cmLocalGenerator::AddGeneratorTarget(cmGeneratorTarget* gt)
{
  this->GeneratorTargets.push_back(gt);
  this->GeneratorTargetSearchIndex.emplace(gt->GetName(), gt);
  this->GlobalGenerator->IndexGeneratorTarget(gt);
}